

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
::emplace<int&,slang::ast::Expression_const*>
          (sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
           *this,int *key,Expression **args)

{
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  pVar1;
  
  current_entry =
       (EntryPointer)
       (((ulong)((long)*key * -0x61c8864680b583eb) >> ((byte)this[0x18] & 0x3f)) * 0x18 +
       *(long *)(this + 8));
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar1 = emplace_new_key<int&,slang::ast::Expression_const*>
                        (this,distance_from_desired,current_entry,key,args);
      return pVar1;
    }
    if (*key == (current_entry->field_1).value.first) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar1._8_8_ = 0;
  pVar1.first.current = current_entry;
  return pVar1;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }